

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testPreviewImage.cpp
# Opt level: O0

void testPreviewImage(string *tempDir)

{
  ostream *poVar1;
  exception *e;
  string filename2;
  string filename1;
  char *in_stack_00000790;
  char *in_stack_00000798;
  char *in_stack_000007a0;
  char *in_stack_ffffffffffffffa0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffa8;
  string local_48 [32];
  string local_28 [40];
  
  std::operator+(in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0);
  std::operator+(in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0);
  poVar1 = std::operator<<((ostream *)&std::cout,"Testing preview image attribute");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  std::__cxx11::string::c_str();
  std::__cxx11::string::c_str();
  anon_unknown.dwarf_1bcc15::readWriteFiles(in_stack_000007a0,in_stack_00000798,in_stack_00000790);
  poVar1 = std::operator<<((ostream *)&std::cout,"ok\n");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  std::__cxx11::string::~string(local_48);
  std::__cxx11::string::~string(local_28);
  return;
}

Assistant:

void
testPreviewImage (const std::string &tempDir)
{
    std::string filename1 = tempDir + "imf_preview1.exr";
    std::string filename2 = tempDir + "imf_preview2.exr";

    try
    {
	cout << "Testing preview image attribute" << endl;

	readWriteFiles (ILM_IMF_TEST_IMAGEDIR "comp_piz.exr",
			filename1.c_str(),
			filename2.c_str());

	cout << "ok\n" << endl;
    }
    catch (const std::exception &e)
    {
	cerr << "ERROR -- caught exception: " << e.what() << endl;
	assert (false);
    }
}